

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

void __thiscall cmQtAutoGenInitializer::InfoWriter::Write(InfoWriter *this,char *key,string *value)

{
  ostream *poVar1;
  string local_40;
  string *local_20;
  string *value_local;
  char *key_local;
  InfoWriter *this_local;
  
  local_20 = value;
  value_local = (string *)key;
  key_local = (char *)this;
  poVar1 = std::operator<<((ostream *)this,"set(");
  poVar1 = std::operator<<(poVar1,(char *)value_local);
  poVar1 = std::operator<<(poVar1," ");
  cmOutputConverter::EscapeForCMake(&local_40,local_20);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  std::operator<<(poVar1,")\n");
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmQtAutoGenInitializer::InfoWriter::Write(const char* key,
                                               std::string const& value)
{
  Ofs_ << "set(" << key << " " << cmOutputConverter::EscapeForCMake(value)
       << ")\n";
}